

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O1

void usage(void)

{
  puts("Pageant: SSH agent");
  puts("Unidentified build");
  puts("Usage: pageant <lifetime> [[--encrypted] key files]");
  puts("       pageant [[--encrypted] key files] --exec <command> [args]");
  puts("       pageant -a [--encrypted] [key files]");
  puts("       pageant -d [key identifiers]");
  puts("       pageant -D");
  puts("       pageant -r [key identifiers]");
  puts("       pageant -R");
  puts("       pageant --public [key identifiers]");
  puts("       pageant ( --public-openssh | -L ) [key identifiers]");
  puts("       pageant -l [-E fptype]");
  puts("Lifetime options, for running Pageant as an agent:");
  puts("  -X           run with the lifetime of the X server");
  puts("  -T           run with the lifetime of the controlling tty");
  puts("  --permanent  run permanently");
  puts("  --debug      run in debugging mode, without forking");
  puts("  --exec <command>   run with the lifetime of that command");
  puts("Client options, for talking to an existing agent:");
  puts("  -a           add key(s) to the existing agent");
  puts("  -l           list currently loaded key fingerprints and comments");
  puts("  --public     print public keys in RFC 4716 format");
  puts("  --public-openssh, -L   print public keys in OpenSSH format");
  puts("  -d           delete key(s) from the agent");
  puts("  -D           delete all keys from the agent");
  puts("  -r           re-encrypt keys in the agent (forget cleartext)");
  puts("  -R           re-encrypt all possible keys in the agent");
  puts("Other options:");
  puts("  -v           verbose mode (in agent mode)");
  puts("  -s -c        force POSIX or C shell syntax (in agent mode)");
  puts("  --symlink path   create symlink to socket (in agent mode)");
  puts("  --encrypted  when adding keys, don\'t decrypt");
  puts("  -E alg, --fptype alg   fingerprint type for -l (sha256, md5)");
  puts("  --tty-prompt force tty-based passphrase prompt");
  puts("  --gui-prompt force GUI-based passphrase prompt");
  puts("  --askpass <prompt>   behave like a standalone askpass program");
  exit(1);
}

Assistant:

static void usage(void)
{
    printf("Pageant: SSH agent\n");
    printf("%s\n", ver);
    printf("Usage: pageant <lifetime> [[--encrypted] key files]\n");
    printf("       pageant [[--encrypted] key files] --exec <command> [args]\n");
    printf("       pageant -a [--encrypted] [key files]\n");
    printf("       pageant -d [key identifiers]\n");
    printf("       pageant -D\n");
    printf("       pageant -r [key identifiers]\n");
    printf("       pageant -R\n");
    printf("       pageant --public [key identifiers]\n");
    printf("       pageant ( --public-openssh | -L ) [key identifiers]\n");
    printf("       pageant -l [-E fptype]\n");
    printf("Lifetime options, for running Pageant as an agent:\n");
    printf("  -X           run with the lifetime of the X server\n");
    printf("  -T           run with the lifetime of the controlling tty\n");
    printf("  --permanent  run permanently\n");
    printf("  --debug      run in debugging mode, without forking\n");
    printf("  --exec <command>   run with the lifetime of that command\n");
    printf("Client options, for talking to an existing agent:\n");
    printf("  -a           add key(s) to the existing agent\n");
    printf("  -l           list currently loaded key fingerprints and comments\n");
    printf("  --public     print public keys in RFC 4716 format\n");
    printf("  --public-openssh, -L   print public keys in OpenSSH format\n");
    printf("  -d           delete key(s) from the agent\n");
    printf("  -D           delete all keys from the agent\n");
    printf("  -r           re-encrypt keys in the agent (forget cleartext)\n");
    printf("  -R           re-encrypt all possible keys in the agent\n");
    printf("Other options:\n");
    printf("  -v           verbose mode (in agent mode)\n");
    printf("  -s -c        force POSIX or C shell syntax (in agent mode)\n");
    printf("  --symlink path   create symlink to socket (in agent mode)\n");
    printf("  --encrypted  when adding keys, don't decrypt\n");
    printf("  -E alg, --fptype alg   fingerprint type for -l (sha256, md5)\n");
    printf("  --tty-prompt force tty-based passphrase prompt\n");
    printf("  --gui-prompt force GUI-based passphrase prompt\n");
    printf("  --askpass <prompt>   behave like a standalone askpass program\n");
    exit(1);
}